

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O1

void * adt_ary_value(adt_ary_t *self,int32_t s32Index)

{
  if (self != (adt_ary_t *)0x0) {
    if (s32Index < 0) {
      s32Index = s32Index + self->s32CurLen;
    }
    return self->pFirst[s32Index];
  }
  return (void *)0x0;
}

Assistant:

void* adt_ary_value(const adt_ary_t *self, int32_t s32Index)
{
	if(self==0){
		return (void*) 0;
	}
	if(s32Index<0){
		//negative index inside array bounds ensured by caller
		s32Index=self->s32CurLen+s32Index;
	}
	return self->pFirst[s32Index];
}